

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

Transaction * __thiscall obx::Transaction::operator=(Transaction *this,Transaction *source)

{
  Transaction *source_local;
  Transaction *this_local;
  
  std::swap<obx::TxMode>(&this->mode_,&source->mode_);
  std::swap<OBX_txn*>(&this->cTxn_,&source->cTxn_);
  return this;
}

Assistant:

Transaction& Transaction::operator=(Transaction source) {
    std::swap(mode_, source.mode_);
    std::swap(cTxn_, source.cTxn_);
    return *this;
}